

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O3

void __thiscall DArgs::CollectFiles(DArgs *this,char *param,char *extension)

{
  TArray<FString,_FString> *this_00;
  uint *puVar1;
  char cVar2;
  FString *pFVar3;
  char *pcVar4;
  DArgs *this_01;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  uint index;
  ulong uVar9;
  TArray<FString,_FString> work;
  TArray<FString,_FString> local_68;
  DArgs *local_50;
  FString local_48;
  char *local_40;
  char *local_38;
  
  local_68.Array = (FString *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  local_40 = param;
  if (extension == (char *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = strlen(extension);
  }
  this_00 = &this->Argv;
  uVar8 = (this->Argv).Count;
  local_50 = this;
  if (1 < uVar8) {
    uVar9 = 1;
    local_38 = extension;
    do {
      pFVar3 = this_00->Array;
      pcVar4 = pFVar3[uVar9].Chars;
      if ((*pcVar4 == '+') || (*pcVar4 == '-')) break;
      if ((sVar7 == 0) ||
         ((sVar7 <= *(uint *)(pcVar4 + -0xc) &&
          (iVar5 = strcasecmp(pcVar4 + (*(uint *)(pcVar4 + -0xc) - sVar7),local_38), iVar5 == 0))))
      {
        TArray<FString,_FString>::Grow(&local_68,1);
        FString::AttachToOther(local_68.Array + ((ulong)local_68._8_8_ >> 0x20),pFVar3 + uVar9);
        local_68.Count = local_68.Count + 1;
        TArray<FString,_FString>::Delete(this_00,(uint)uVar9);
        uVar8 = (local_50->Argv).Count;
      }
      else {
        uVar9 = (ulong)((uint)uVar9 + 1);
      }
    } while ((uint)uVar9 < uVar8);
    if ((uint)uVar9 < uVar8) {
      do {
        pFVar3 = this_00->Array;
        iVar5 = uVar8 - (int)uVar9;
        uVar9 = uVar9 & 0xffffffff;
        while (iVar6 = strcasecmp(local_40,pFVar3[uVar9].Chars), iVar6 != 0) {
          uVar9 = uVar9 + 1;
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) goto LAB_003a043b;
        }
        if (uVar9 == 0) break;
        index = (uint)uVar9;
        TArray<FString,_FString>::Delete(this_00,index);
        uVar8 = (local_50->Argv).Count;
        if (index < uVar8) {
          do {
            pFVar3 = this_00->Array;
            cVar2 = *pFVar3[uVar9 & 0xffffffff].Chars;
            if ((cVar2 == '+') || (cVar2 == '-')) break;
            TArray<FString,_FString>::Grow(&local_68,1);
            FString::AttachToOther
                      (local_68.Array + ((ulong)local_68._8_8_ >> 0x20),
                       pFVar3 + (uVar9 & 0xffffffff));
            local_68.Count = local_68.Count + 1;
            TArray<FString,_FString>::Delete(this_00,index);
            uVar8 = (local_50->Argv).Count;
          } while (index < uVar8);
        }
      } while (index < uVar8);
    }
  }
LAB_003a043b:
  if (local_68.Count != 0) {
    FString::FString(&local_48,local_40);
    TArray<FString,_FString>::Grow(this_00,1);
    this_01 = local_50;
    FString::AttachToOther((local_50->Argv).Array + (local_50->Argv).Count,&local_48);
    puVar1 = &(this_01->Argv).Count;
    *puVar1 = *puVar1 + 1;
    FString::~FString(&local_48);
    AppendArgs(this_01,local_68.Count,local_68.Array);
  }
  TArray<FString,_FString>::~TArray(&local_68);
  return;
}

Assistant:

void DArgs::CollectFiles(const char *param, const char *extension)
{
	TArray<FString> work;
	unsigned int i;
	size_t extlen = extension == NULL ? 0 : strlen(extension);

	// Step 1: Find suitable arguments before the first switch.
	i = 1;
	while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
	{
		bool useit;

		if (extlen > 0)
		{ // Argument's extension must match.
			size_t len = Argv[i].Len();
			useit = (len >= extlen && stricmp(&Argv[i][len - extlen], extension) == 0);
		}
		else
		{ // Anything will do so long as it's before the first switch.
			useit = true;
		}
		if (useit)
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
		else
		{
			i++;
		}
	}

	// Step 2: Find each occurence of -param and add its arguments to work.
	while ((i = CheckParm(param, i)) > 0)
	{
		Argv.Delete(i);
		while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
	}

	// Optional: Replace short path names with long path names
#ifdef _WIN32
	for (i = 0; i < work.Size(); ++i)
	{
		work[i] = I_GetLongPathName(work[i]);
	}
#endif

	// Step 3: Add work back to Argv, as long as it's non-empty.
	if (work.Size() > 0)
	{
		Argv.Push(param);
		AppendArgs(work.Size(), &work[0]);
	}
}